

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

value * __thiscall
mjs::interpreter::impl::operator()(value *__return_storage_ptr__,impl *this,binary_expression *e)

{
  bool bVar1;
  int iVar2;
  token_type tVar3;
  void *pvVar4;
  long *plVar5;
  void *pvVar6;
  undefined8 *puVar7;
  gc_heap_ptr_untyped *pgVar8;
  object *this_00;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar9;
  native_error_exception *pnVar10;
  wostream *os;
  value *this_01;
  value o;
  value l;
  object local_258;
  value r;
  wstring_view local_210 [2];
  wstring_view local_1f0;
  value l_1;
  wstring_view local_68;
  value local_58;
  
  if (e->op_ == comma) {
    eval(&l_1,this,
         (e->lhs_)._M_t.
         super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
         super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
         super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
    get_value(&local_58,this,&l_1);
    value::~value(&local_58);
    value::~value(&l_1);
    eval(&l_1,this,
         (e->rhs_)._M_t.
         super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
         super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
         super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
    get_value(__return_storage_ptr__,this,&l_1);
  }
  else {
    iVar2 = operator_precedence(e->op_);
    if (iVar2 != 0xf) {
      eval(&l_1,this,
           (e->lhs_)._M_t.
           super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
           super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
           super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
      get_value(&l,this,&l_1);
      value::~value(&l_1);
      tVar3 = e->op_;
      if (tVar3 == andand) {
        bVar1 = to_boolean(&l);
        if (bVar1) {
          tVar3 = e->op_;
          goto LAB_0013024d;
        }
LAB_00130260:
        value::value(__return_storage_ptr__,&l);
      }
      else {
LAB_0013024d:
        if (tVar3 == oror) {
          bVar1 = to_boolean(&l);
          if (bVar1) goto LAB_00130260;
        }
        eval(&l_1,this,
             (e->rhs_)._M_t.
             super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
             super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
             super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
        get_value(&r,this,&l_1);
        value::~value(&l_1);
        tVar3 = e->op_;
        if (tVar3 - andand < 2) {
          value::value(__return_storage_ptr__,&r);
        }
        else if (tVar3 == dot) {
LAB_001302e2:
          make_reference(__return_storage_ptr__,this,&l,&r);
        }
        else if (tVar3 == instanceof_) {
          if (r.type_ != object) {
LAB_00130522:
            std::__cxx11::wostringstream::wostringstream((wostringstream *)&l_1);
            pbVar9 = mjs::operator<<((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)&l_1,
                                     r.type_);
            std::operator<<(pbVar9," is not an object");
            pnVar10 = (native_error_exception *)__cxa_allocate_exception(0x58);
            stack_trace_abi_cxx11_((wstring *)&o,this);
            local_210[0]._M_len = (size_t)o.field_1.n_;
            std::__cxx11::wstringbuf::str();
            local_1f0._M_len = (size_t)local_258.heap_;
            local_1f0._M_str = (wchar_t *)local_258._vptr_object;
            native_error_exception::native_error_exception(pnVar10,type,local_210,&local_1f0);
            __cxa_throw(pnVar10,&native_error_exception::typeinfo,
                        native_error_exception::~native_error_exception);
          }
          pgVar8 = &value::object_value(&r)->super_gc_heap_ptr_untyped;
          gc_heap_ptr_untyped::get(pgVar8);
          object::prototype((object *)&l_1);
          pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&l_1);
          plVar5 = (long *)gc_heap_ptr_untyped::get(&(this->global_).super_gc_heap_ptr_untyped);
          (**(code **)(*plVar5 + 0x60))(&o,plVar5);
          pvVar6 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&o);
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&o);
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&l_1);
          if (pvVar4 != pvVar6) goto LAB_00130522;
          if (l.type_ == object) {
            pgVar8 = &value::object_value(&r)->super_gc_heap_ptr_untyped;
            puVar7 = (undefined8 *)gc_heap_ptr_untyped::get(pgVar8);
            l_1.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
                 (gc_heap *)L"prototype";
            l_1._0_8_ = 9;
            (**(code **)*puVar7)(&o,puVar7);
            if (o.type_ != object) {
              std::__cxx11::wostringstream::wostringstream((wostringstream *)&l_1);
              os = std::operator<<((wostream *)&l_1,"Function has non-object prototype of type ");
              pbVar9 = mjs::operator<<(os,o.type_);
              std::operator<<(pbVar9," in instanceof check");
              pnVar10 = (native_error_exception *)__cxa_allocate_exception(0x58);
              stack_trace_abi_cxx11_((wstring *)&local_258,this);
              local_1f0._M_len = (size_t)local_258.heap_;
              local_1f0._M_str = (wchar_t *)local_258._vptr_object;
              std::__cxx11::wstringbuf::str();
              local_68._M_len = (size_t)local_210[0]._M_str;
              local_68._M_str = (wchar_t *)local_210[0]._M_len;
              native_error_exception::native_error_exception(pnVar10,type,&local_1f0,&local_68);
              __cxa_throw(pnVar10,&native_error_exception::typeinfo,
                          native_error_exception::~native_error_exception);
            }
            pgVar8 = &value::object_value(&l)->super_gc_heap_ptr_untyped;
            gc_heap_ptr_untyped::get(pgVar8);
            object::prototype((object *)&l_1);
            while (l_1._0_8_ != 0) {
              pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&l_1);
              pgVar8 = &value::object_value(&o)->super_gc_heap_ptr_untyped;
              pvVar6 = gc_heap_ptr_untyped::get(pgVar8);
              if (pvVar4 == pvVar6) {
                bVar1 = true;
                goto LAB_001304db;
              }
              gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&l_1);
              object::prototype(&local_258);
              gc_heap_ptr_untyped::operator=
                        ((gc_heap_ptr_untyped *)&l_1,(gc_heap_ptr_untyped *)&local_258);
              gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_258);
            }
            bVar1 = false;
LAB_001304db:
            __return_storage_ptr__->type_ = boolean;
            (__return_storage_ptr__->field_1).b_ = bVar1;
            gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&l_1);
            value::~value(&o);
          }
          else {
            __return_storage_ptr__->type_ = boolean;
            (__return_storage_ptr__->field_1).b_ = false;
          }
        }
        else if (tVar3 == in_) {
          if (r.type_ != object) {
            std::__cxx11::wostringstream::wostringstream((wostringstream *)&l_1);
            pbVar9 = mjs::operator<<((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)&l_1,
                                     r.type_);
            std::operator<<(pbVar9," is not an object");
            pnVar10 = (native_error_exception *)__cxa_allocate_exception(0x58);
            stack_trace_abi_cxx11_((wstring *)&o,this);
            local_210[0]._M_len = (size_t)o.field_1.n_;
            std::__cxx11::wstringbuf::str();
            local_1f0._M_len = (size_t)local_258.heap_;
            local_1f0._M_str = (wchar_t *)local_258._vptr_object;
            native_error_exception::native_error_exception(pnVar10,type,local_210,&local_1f0);
            __cxa_throw(pnVar10,&native_error_exception::typeinfo,
                        native_error_exception::~native_error_exception);
          }
          pgVar8 = &value::object_value(&r)->super_gc_heap_ptr_untyped;
          this_00 = (object *)gc_heap_ptr_untyped::get(pgVar8);
          to_string((mjs *)&o,this->heap_,&l);
          l_1._0_16_ = string::view((string *)&o);
          bVar1 = object::has_property(this_00,(wstring_view *)&l_1);
          __return_storage_ptr__->type_ = boolean;
          (__return_storage_ptr__->field_1).b_ = bVar1;
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&o);
        }
        else {
          if (tVar3 == lbracket) goto LAB_001302e2;
          do_binary_op(__return_storage_ptr__,this,tVar3,&l,&r);
        }
        value::~value(&r);
      }
      this_01 = &l;
      goto LAB_00130508;
    }
    eval(&l_1,this,
         (e->lhs_)._M_t.
         super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
         super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
         super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
    eval(&l,this,(e->rhs_)._M_t.
                 super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
                 super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
                 super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
    get_value(__return_storage_ptr__,this,&l);
    value::~value(&l);
    if (e->op_ != equal) {
      get_value(&l,this,&l_1);
      tVar3 = without_assignment(e->op_);
      do_binary_op(&r,this,tVar3,&l,__return_storage_ptr__);
      value::operator=(__return_storage_ptr__,&r);
      value::~value(&r);
      value::~value(&l);
    }
    put_value(this,&l_1,__return_storage_ptr__);
  }
  this_01 = &l_1;
LAB_00130508:
  value::~value(this_01);
  return __return_storage_ptr__;
}

Assistant:

value operator()(const binary_expression& e) {
        if (e.op() == token_type::comma) {
            (void)get_value(eval(e.lhs()));;
            return get_value(eval(e.rhs()));
        }
        if (operator_precedence(e.op()) == assignment_precedence) {
            auto l = eval(e.lhs());
            auto r = get_value(eval(e.rhs()));
            if (e.op() != token_type::equal) {
                auto lval = get_value(l);
                r = do_binary_op(without_assignment(e.op()), lval, r);
            }
            put_value(l, r);
            return r;
        }

        auto l = get_value(eval(e.lhs()));
        if ((e.op() == token_type::andand && !to_boolean(l)) || (e.op() == token_type::oror && to_boolean(l))) {
            return l;
        }
        auto r = get_value(eval(e.rhs()));
        if (e.op() == token_type::andand || e.op() == token_type::oror) {
            return r;
        } else if (is_reference_op(e.op())) {
            return make_reference(l, r);
        } else if (e.op() == token_type::in_) {
            if (r.type() != value_type::object) {
                std::wostringstream woss;
                woss << r.type() << " is not an object";
                throw native_error_exception{native_error_type::type, stack_trace(), woss.str()};
            }
            return value{r.object_value()->has_property(to_string(heap_, l).view())};
        } else if (e.op() == token_type::instanceof_) {
            if (r.type() != value_type::object || r.object_value()->prototype().get() != global_->function_prototype().get()) {
                std::wostringstream woss;
                woss << r.type() << " is not an object";
                throw native_error_exception{native_error_type::type, stack_trace(), woss.str()};
            }
            // ES3, 15.3.5.3 [[HasInstance]] (only implemented for Function objects)
            if (l.type() != value_type::object) {
                return value{false};
            }
            auto o = r.object_value()->get(L"prototype");
            if (o.type() != value_type::object) {
                std::wostringstream woss;
                woss << "Function has non-object prototype of type " << o.type() << " in instanceof check";
                throw native_error_exception{native_error_type::type, stack_trace(), woss.str()};
            }
            auto v = l.object_value()->prototype();
            for (;;) {
                if (!v) {
                    return value{false};
                }
                if (v.get() == o.object_value().get()) { // TODO: handle joined objects (ES3, 13.1.2)
                    return value{true};
                }
                v = v->prototype();
            }

        }
        return do_binary_op(e.op(), l, r);
    }